

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void output_bb_border_live_info(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  MIR_reg_t *local_28;
  MIR_reg_t *map;
  bb_t_conflict bb_local;
  gen_ctx_t gen_ctx_local;
  
  if (gen_ctx->lr_ctx->scan_vars_num == 0) {
    local_28 = (MIR_reg_t *)0x0;
  }
  else {
    local_28 = VARR_MIR_reg_taddr(gen_ctx->lr_ctx->scan_var_to_var_map);
  }
  output_bitmap(gen_ctx,"  live_in:",bb->in,1,local_28);
  output_bitmap(gen_ctx,"  live_out:",bb->out,1,local_28);
  return;
}

Assistant:

static void output_bb_border_live_info (gen_ctx_t gen_ctx, bb_t bb) {
  MIR_reg_t *map = scan_vars_num == 0 ? NULL : VARR_ADDR (MIR_reg_t, scan_var_to_var_map);
  output_bitmap (gen_ctx, "  live_in:", bb->live_in, TRUE, map);
  output_bitmap (gen_ctx, "  live_out:", bb->live_out, TRUE, map);
}